

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

uint __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_int>,unsigned_int>
          (STObject *this,SField *field)

{
  int iVar1;
  uint uVar2;
  STBase *pSVar3;
  long lVar4;
  
  pSVar3 = peekAtPField(this,field);
  if (pSVar3 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar3->_vptr_STBase[4])(pSVar3);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    lVar4 = __dynamic_cast(pSVar3,&STBase::typeinfo,&STInteger<unsigned_int>::typeinfo,0);
    if (lVar4 == 0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    uVar2 = *(uint *)(lVar4 + 0x10);
  }
  return uVar2;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }